

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O3

Node * __thiscall
anon_unknown.dwarf_38a::NinjaMain::CollectTarget(NinjaMain *this,char *cpath,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppEVar2;
  Edge *this_00;
  pointer ppNVar3;
  bool bVar4;
  int iVar5;
  Node *pNVar6;
  long *plVar7;
  size_type *psVar8;
  long *plVar9;
  StringPiece path_00;
  string path;
  uint64_t slash_bits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  uint64_t local_50;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,cpath,(allocator<char> *)&local_90);
  bVar4 = CanonicalizePath(&local_70,&local_50,err);
  if (bVar4) {
    if (local_70._M_string_length == 0) {
      local_70._M_string_length = 0;
LAB_00107ffd:
      bVar4 = false;
    }
    else {
      if (local_70._M_dataplus._M_p[local_70._M_string_length - 1] != '^') goto LAB_00107ffd;
      std::__cxx11::string::resize((ulong)&local_70,(char)local_70._M_string_length + -1);
      bVar4 = true;
    }
    path_00.len_ = local_70._M_string_length;
    path_00.str_ = local_70._M_dataplus._M_p;
    pNVar6 = State::LookupNode(&this->state_,path_00);
    if (pNVar6 == (Node *)0x0) {
      Node::PathDecanonicalized(&local_48,&local_70,local_50);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x1234a3);
      paVar1 = &local_b0.field_2;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_b0.field_2._M_allocated_capacity = *psVar8;
        local_b0.field_2._8_8_ = plVar7[3];
        local_b0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar8;
        local_b0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_b0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_80 = *plVar9;
        lStack_78 = plVar7[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar9;
        local_90 = (long *)*plVar7;
      }
      local_88 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)err,(string *)&local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_70);
      if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_70), iVar5 == 0)) {
        std::__cxx11::string::append((char *)err);
      }
      else {
        pNVar6 = State::SpellcheckNode(&this->state_,&local_70);
        if (pNVar6 != (Node *)0x0) {
          std::operator+(&local_b0,", did you mean \'",&pNVar6->path_);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
          plVar9 = plVar7 + 2;
          if ((long *)*plVar7 == plVar9) {
            local_80 = *plVar9;
            lStack_78 = plVar7[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *plVar9;
            local_90 = (long *)*plVar7;
          }
          local_88 = plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)err,(ulong)local_90);
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != paVar1) goto LAB_001082ba;
        }
      }
    }
    else {
      if (!bVar4) goto LAB_001082ca;
      ppEVar2 = (pNVar6->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppEVar2 !=
          (pNVar6->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = *ppEVar2;
        ppNVar3 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (ppNVar3 ==
            (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          Edge::Dump(this_00,"");
          Fatal("edge has no outputs");
        }
        pNVar6 = *ppNVar3;
        goto LAB_001082ca;
      }
      std::operator+(&local_b0,"\'",&local_70);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_80 = *plVar9;
        lStack_78 = plVar7[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar9;
        local_90 = (long *)*plVar7;
      }
      local_88 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)err,(string *)&local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
LAB_001082ba:
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pNVar6 = (Node *)0x0;
LAB_001082ca:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return pNVar6;
}

Assistant:

Node* NinjaMain::CollectTarget(const char* cpath, string* err) {
  string path = cpath;
  uint64_t slash_bits;
  if (!CanonicalizePath(&path, &slash_bits, err))
    return NULL;

  // Special syntax: "foo.cc^" means "the first output of foo.cc".
  bool first_dependent = false;
  if (!path.empty() && path[path.size() - 1] == '^') {
    path.resize(path.size() - 1);
    first_dependent = true;
  }

  Node* node = state_.LookupNode(path);
  if (node) {
    if (first_dependent) {
      if (node->out_edges().empty()) {
        *err = "'" + path + "' has no out edge";
        return NULL;
      }
      Edge* edge = node->out_edges()[0];
      if (edge->outputs_.empty()) {
        edge->Dump();
        Fatal("edge has no outputs");
      }
      node = edge->outputs_[0];
    }
    return node;
  } else {
    *err =
        "unknown target '" + Node::PathDecanonicalized(path, slash_bits) + "'";
    if (path == "clean") {
      *err += ", did you mean 'ninja -t clean'?";
    } else if (path == "help") {
      *err += ", did you mean 'ninja -h'?";
    } else {
      Node* suggestion = state_.SpellcheckNode(path);
      if (suggestion) {
        *err += ", did you mean '" + suggestion->path() + "'?";
      }
    }
    return NULL;
  }
}